

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void TPZSkylMatrix<double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<double> *storage,TPZVec<double_*> *point)

{
  long *plVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t dim;
  long lVar6;
  double local_30;
  
  lVar6 = skyline->fNElements;
  if (lVar6 < 1) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar4 = lVar5;
      plVar1 = skyline->fStore + lVar3;
      lVar5 = lVar4 + lVar3;
      lVar3 = lVar3 + 1;
      lVar5 = (lVar5 + 1) - *plVar1;
    } while (lVar6 != lVar3);
    lVar3 = (lVar4 - *plVar1) + lVar3;
  }
  (*storage->_vptr_TPZVec[3])(storage,lVar3);
  local_30 = 0.0;
  TPZVec<double>::Fill(storage,&local_30,0,-1);
  (*point->_vptr_TPZVec[3])(point,lVar6 + 1);
  if (lVar6 == 0) {
    *point->fStore = (double *)0x0;
  }
  else {
    pdVar2 = storage->fStore;
    *point->fStore = pdVar2;
    point->fStore[lVar6] = pdVar2 + lVar3;
    if (0 < lVar6) {
      lVar3 = 8;
      do {
        *(long *)((long)point->fStore + lVar3) =
             *(long *)((long)point->fStore + lVar3 + -8) +
             *(long *)((long)skyline->fStore + lVar3 + -8) * -8 + lVar3;
        lVar3 = lVar3 + 8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}